

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O1

bool embree::avx::SphereMiIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *sphere)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  Scene *pSVar4;
  Geometry *pGVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  float fVar46;
  float fVar54;
  float fVar55;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar56;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  RTCFilterFunctionNArguments args;
  SphereIntersectorHitM<4> hit;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined8 local_2d0;
  float fStack_2c8;
  float fStack_2c4;
  RayK<8> *local_2b8;
  RTCFilterFunctionNArguments local_2b0;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  undefined1 auStack_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar71 [64];
  
  pSVar4 = context->scene;
  pGVar5 = (pSVar4->geometries).items[sphere->sharedGeomID].ptr;
  lVar29 = *(long *)&pGVar5->field_0x58;
  _Var6 = pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar47 = *(undefined1 (*) [16])(lVar29 + (sphere->primIDs).field_0.i[0] * _Var6);
  auVar42 = *(undefined1 (*) [16])(lVar29 + (sphere->primIDs).field_0.i[1] * _Var6);
  auVar52 = *(undefined1 (*) [16])(lVar29 + (sphere->primIDs).field_0.i[2] * _Var6);
  auVar3 = *(undefined1 (*) [16])(lVar29 + (sphere->primIDs).field_0.i[3] * _Var6);
  auVar57 = vunpcklps_avx(auVar47,auVar52);
  auVar47 = vunpckhps_avx(auVar47,auVar52);
  auVar52 = vunpcklps_avx(auVar42,auVar3);
  auVar42 = vunpckhps_avx(auVar42,auVar3);
  auVar3 = vunpcklps_avx(auVar57,auVar52);
  auVar52 = vunpckhps_avx(auVar57,auVar52);
  auVar34 = vunpcklps_avx(auVar47,auVar42);
  auVar49 = vunpckhps_avx(auVar47,auVar42);
  auVar47 = vpshufd_avx(ZEXT116(sphere->numPrimitives),0);
  auVar42 = vpcmpgtd_avx(auVar47,_DAT_01ff0cf0);
  local_1b0 = vpshufd_avx(ZEXT416(sphere->sharedGeomID),0);
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar62._4_4_ = uVar1;
  auVar62._0_4_ = uVar1;
  auVar62._8_4_ = uVar1;
  auVar62._12_4_ = uVar1;
  auVar3 = vsubps_avx(auVar3,auVar62);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar57 = vsubps_avx(auVar52,auVar57);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar34 = vsubps_avx(auVar34,auVar47);
  local_2d0._0_4_ = *(float *)(ray + k * 4 + 0x80);
  fVar72 = *(float *)(ray + k * 4 + 0xa0);
  local_2e0 = *(float *)(ray + k * 4 + 0xc0);
  auVar47 = ZEXT416((uint)((float)local_2d0 * (float)local_2d0 +
                          fVar72 * fVar72 + local_2e0 * local_2e0));
  auVar52 = vshufps_avx(auVar47,auVar47,0);
  auVar47 = vrcpps_avx(auVar52);
  fVar46 = auVar47._0_4_;
  auVar48._0_4_ = fVar46 * auVar52._0_4_;
  fVar54 = auVar47._4_4_;
  auVar48._4_4_ = fVar54 * auVar52._4_4_;
  fVar55 = auVar47._8_4_;
  auVar48._8_4_ = fVar55 * auVar52._8_4_;
  fVar56 = auVar47._12_4_;
  auVar48._12_4_ = fVar56 * auVar52._12_4_;
  auVar52._8_4_ = 0x3f800000;
  auVar52._0_8_ = &DAT_3f8000003f800000;
  auVar52._12_4_ = 0x3f800000;
  auVar47 = vsubps_avx(auVar52,auVar48);
  fVar46 = fVar46 + fVar46 * auVar47._0_4_;
  fVar54 = fVar54 + fVar54 * auVar47._4_4_;
  fVar55 = fVar55 + fVar55 * auVar47._8_4_;
  fVar56 = fVar56 + fVar56 * auVar47._12_4_;
  auVar58._0_4_ =
       ((float)local_2d0 * auVar3._0_4_ + fVar72 * auVar57._0_4_ + local_2e0 * auVar34._0_4_) *
       fVar46;
  auVar58._4_4_ =
       ((float)local_2d0 * auVar3._4_4_ + fVar72 * auVar57._4_4_ + local_2e0 * auVar34._4_4_) *
       fVar54;
  auVar58._8_4_ =
       ((float)local_2d0 * auVar3._8_4_ + fVar72 * auVar57._8_4_ + local_2e0 * auVar34._8_4_) *
       fVar55;
  auVar58._12_4_ =
       ((float)local_2d0 * auVar3._12_4_ + fVar72 * auVar57._12_4_ + local_2e0 * auVar34._12_4_) *
       fVar56;
  auVar65._0_4_ = (float)local_2d0 * auVar58._0_4_;
  auVar65._4_4_ = (float)local_2d0 * auVar58._4_4_;
  auVar65._8_4_ = (float)local_2d0 * auVar58._8_4_;
  auVar65._12_4_ = (float)local_2d0 * auVar58._12_4_;
  auVar67._0_4_ = fVar72 * auVar58._0_4_;
  auVar67._4_4_ = fVar72 * auVar58._4_4_;
  auVar67._8_4_ = fVar72 * auVar58._8_4_;
  auVar67._12_4_ = fVar72 * auVar58._12_4_;
  auVar69._0_4_ = local_2e0 * auVar58._0_4_;
  auVar69._4_4_ = local_2e0 * auVar58._4_4_;
  auVar69._8_4_ = local_2e0 * auVar58._8_4_;
  auVar69._12_4_ = local_2e0 * auVar58._12_4_;
  auVar52 = vsubps_avx(auVar3,auVar65);
  auVar66 = ZEXT1664(auVar52);
  auVar3 = vsubps_avx(auVar57,auVar67);
  auVar64 = ZEXT1664(auVar3);
  auVar57 = vsubps_avx(auVar34,auVar69);
  auVar68 = ZEXT1664(auVar57);
  auVar61._0_4_ =
       auVar52._0_4_ * auVar52._0_4_ + auVar3._0_4_ * auVar3._0_4_ + auVar57._0_4_ * auVar57._0_4_;
  auVar61._4_4_ =
       auVar52._4_4_ * auVar52._4_4_ + auVar3._4_4_ * auVar3._4_4_ + auVar57._4_4_ * auVar57._4_4_;
  auVar61._8_4_ =
       auVar52._8_4_ * auVar52._8_4_ + auVar3._8_4_ * auVar3._8_4_ + auVar57._8_4_ * auVar57._8_4_;
  auVar61._12_4_ =
       auVar52._12_4_ * auVar52._12_4_ +
       auVar3._12_4_ * auVar3._12_4_ + auVar57._12_4_ * auVar57._12_4_;
  auVar41._0_4_ = auVar49._0_4_ * auVar49._0_4_;
  auVar41._4_4_ = auVar49._4_4_ * auVar49._4_4_;
  auVar41._8_4_ = auVar49._8_4_ * auVar49._8_4_;
  auVar41._12_4_ = auVar49._12_4_ * auVar49._12_4_;
  auVar47 = vcmpps_avx(auVar61,auVar41,2);
  auVar34 = auVar42 & auVar47;
  if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar34[0xf] < '\0') {
    auVar47 = vandps_avx(auVar47,auVar42);
    auVar42 = vsubps_avx(auVar41,auVar61);
    auVar34._0_4_ = fVar46 * auVar42._0_4_;
    auVar34._4_4_ = fVar54 * auVar42._4_4_;
    auVar34._8_4_ = fVar55 * auVar42._8_4_;
    auVar34._12_4_ = fVar56 * auVar42._12_4_;
    auVar41 = vsqrtps_avx(auVar34);
    auVar77 = ZEXT1664(auVar41);
    auVar48 = vsubps_avx(auVar58,auVar41);
    auVar70._0_4_ = auVar41._0_4_ + auVar58._0_4_;
    auVar70._4_4_ = auVar41._4_4_ + auVar58._4_4_;
    auVar70._8_4_ = auVar41._8_4_ + auVar58._8_4_;
    auVar70._12_4_ = auVar41._12_4_ + auVar58._12_4_;
    auVar71 = ZEXT1664(auVar70);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
    auVar49._4_4_ = uVar1;
    auVar49._0_4_ = uVar1;
    auVar49._8_4_ = uVar1;
    auVar49._12_4_ = uVar1;
    auVar42 = vcmpps_avx(auVar49,auVar48,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar59._4_4_ = uVar1;
    auVar59._0_4_ = uVar1;
    auVar59._8_4_ = uVar1;
    auVar59._12_4_ = uVar1;
    auVar34 = vcmpps_avx(auVar48,auVar59,2);
    auVar42 = vandps_avx(auVar34,auVar42);
    auVar78 = ZEXT1664(auVar42);
    auVar42 = vandps_avx(auVar42,auVar47);
    auVar34 = vcmpps_avx(auVar49,auVar70,2);
    auVar49 = vcmpps_avx(auVar70,auVar59,2);
    auVar34 = vandps_avx(auVar34,auVar49);
    auVar47 = vandps_avx(auVar34,auVar47);
    auVar79 = ZEXT1664(auVar47);
    auVar47 = vorps_avx(auVar47,auVar42);
    iVar27 = vmovmskps_avx(auVar47);
    if (iVar27 != 0) {
      local_1f0 = vblendvps_avx(auVar70,auVar48,auVar42);
      auVar50._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
      auVar50._8_4_ = -auVar41._8_4_;
      auVar50._12_4_ = -auVar41._12_4_;
      auVar47 = vblendvps_avx(auVar41,auVar50,auVar42);
      fVar46 = auVar47._0_4_;
      auVar51._0_4_ = (float)local_2d0 * fVar46;
      fVar54 = auVar47._4_4_;
      auVar51._4_4_ = (float)local_2d0 * fVar54;
      fVar55 = auVar47._8_4_;
      auVar51._8_4_ = (float)local_2d0 * fVar55;
      fVar56 = auVar47._12_4_;
      auVar51._12_4_ = (float)local_2d0 * fVar56;
      auVar60._0_4_ = fVar72 * fVar46;
      auVar60._4_4_ = fVar72 * fVar54;
      auVar60._8_4_ = fVar72 * fVar55;
      auVar60._12_4_ = fVar72 * fVar56;
      auVar42._0_4_ = local_2e0 * fVar46;
      auVar42._4_4_ = local_2e0 * fVar54;
      auVar42._8_4_ = local_2e0 * fVar55;
      auVar42._12_4_ = local_2e0 * fVar56;
      local_1e0 = vsubps_avx(auVar51,auVar52);
      local_1d0 = vsubps_avx(auVar60,auVar3);
      local_1c0 = vsubps_avx(auVar42,auVar57);
      uVar31 = (ulong)(byte)iVar27;
      uVar28 = 1 << ((byte)k & 0x1f);
      uVar30 = (ulong)((uVar28 & 0xf) << 4);
      lVar29 = (long)((int)uVar28 >> 4) * 0x10;
      auVar63 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      local_2d0._4_4_ = (float)local_2d0;
      fVar46 = (float)local_2d0;
      fVar54 = (float)local_2d0;
      fVar55 = fVar72;
      fVar56 = fVar72;
      fVar73 = fVar72;
      fVar74 = local_2e0;
      fVar75 = local_2e0;
      fVar76 = local_2e0;
      do {
        auVar37 = _local_280;
        local_2b0.hit = (RTCHitN *)local_180;
        local_2b0.valid = (int *)&local_300;
        uVar8 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar28 = *(uint *)(local_1b0 + uVar8 * 4);
        pGVar5 = (pSVar4->geometries).items[uVar28].ptr;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar31 = uVar31 ^ 1L << (uVar8 & 0x3f);
          bVar32 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar32 = false;
        }
        else {
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1f0 + uVar8 * 4);
          local_2b0.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar28),0);
          local_e0 = (sphere->primIDs).field_0.i[uVar8];
          local_180._4_4_ = *(undefined4 *)(local_1e0 + uVar8 * 4);
          local_160._4_4_ = *(undefined4 *)(local_1d0 + uVar8 * 4);
          uVar2 = *(undefined4 *)(local_1c0 + uVar8 * 4);
          local_140._4_4_ = uVar2;
          local_140._0_4_ = uVar2;
          local_140._8_4_ = uVar2;
          local_140._12_4_ = uVar2;
          local_140._16_4_ = uVar2;
          local_140._20_4_ = uVar2;
          local_140._24_4_ = uVar2;
          local_140._28_4_ = uVar2;
          local_180._0_4_ = local_180._4_4_;
          local_180._8_4_ = local_180._4_4_;
          local_180._12_4_ = local_180._4_4_;
          local_180._16_4_ = local_180._4_4_;
          local_180._20_4_ = local_180._4_4_;
          local_180._24_4_ = local_180._4_4_;
          local_180._28_4_ = local_180._4_4_;
          local_160._0_4_ = local_160._4_4_;
          local_160._8_4_ = local_160._4_4_;
          local_160._12_4_ = local_160._4_4_;
          local_160._16_4_ = local_160._4_4_;
          local_160._20_4_ = local_160._4_4_;
          local_160._24_4_ = local_160._4_4_;
          local_160._28_4_ = local_160._4_4_;
          local_100 = ZEXT1232(ZEXT412(0)) << 0x20;
          local_120 = local_100;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          auVar39 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar39 = vcmpps_avx(auVar39,auVar39,0xf);
          uStack_9c = (local_2b0.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_2b0.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_300 = *(undefined8 *)(mm_lookupmask_ps + uVar30);
          uStack_2f8 = *(undefined8 *)(mm_lookupmask_ps + uVar30 + 8);
          local_2f0 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
          uStack_2e8 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
          local_2b0.geometryUserPtr = pGVar5->userPtr;
          local_2b0.N = 8;
          local_2b0.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_280._4_4_ = fVar55;
            local_280._0_4_ = fVar72;
            fStack_278 = fVar56;
            auStack_270 = auVar37._16_16_;
            fStack_274 = fVar73;
            local_200 = auVar66._0_16_;
            local_210 = auVar64._0_16_;
            local_220 = auVar68._0_16_;
            local_230 = auVar71._0_16_;
            local_240 = auVar77._0_16_;
            local_250 = auVar78._0_16_;
            local_260 = auVar79._0_16_;
            fStack_2dc = fVar74;
            fStack_2d8 = fVar75;
            fStack_2d4 = fVar76;
            fStack_2c8 = fVar46;
            fStack_2c4 = fVar54;
            local_2b8 = ray;
            local_1a0 = auVar39;
            (*pGVar5->occlusionFilterN)(&local_2b0);
            auVar79 = ZEXT1664(local_260);
            auVar78 = ZEXT1664(local_250);
            auVar77 = ZEXT1664(local_240);
            auVar71 = ZEXT1664(local_230);
            auVar68 = ZEXT1664(local_220);
            auVar64 = ZEXT1664(local_210);
            auVar66 = ZEXT1664(local_200);
            auVar63 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            ray = local_2b8;
            auVar39 = local_1a0;
            fVar46 = fStack_2c8;
            fVar54 = fStack_2c4;
            fVar72 = (float)local_280._0_4_;
            fVar55 = (float)local_280._4_4_;
            fVar56 = fStack_278;
            fVar73 = fStack_274;
            fVar74 = fStack_2dc;
            fVar75 = fStack_2d8;
            fVar76 = fStack_2d4;
          }
          auVar38 = _local_280;
          auVar52 = ZEXT816(0) << 0x40;
          auVar3._8_8_ = uStack_2f8;
          auVar3._0_8_ = local_300;
          auVar47 = vpcmpeqd_avx(auVar52,auVar3);
          auVar23._8_8_ = uStack_2e8;
          auVar23._0_8_ = local_2f0;
          auVar42 = vpcmpeqd_avx(auVar52,auVar23);
          auVar37._16_16_ = auVar42;
          auVar37._0_16_ = auVar47;
          auVar37 = auVar39 & ~auVar37;
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0x7f,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar37 >> 0xbf,0) == '\0') &&
              (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar37[0x1f]) {
            auVar38._0_4_ = auVar47._0_4_ ^ auVar39._0_4_;
            auVar38._4_4_ = auVar47._4_4_ ^ auVar39._4_4_;
            auVar38._8_4_ = auVar47._8_4_ ^ auVar39._8_4_;
            auVar38._12_4_ = auVar47._12_4_ ^ auVar39._12_4_;
            auVar38._16_4_ = auVar42._0_4_ ^ auVar39._16_4_;
            auVar38._20_4_ = auVar42._4_4_ ^ auVar39._20_4_;
            auVar38._24_4_ = auVar42._8_4_ ^ auVar39._24_4_;
            auVar38._28_4_ = auVar42._12_4_ ^ auVar39._28_4_;
          }
          else {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              local_280._4_4_ = fVar55;
              local_280._0_4_ = fVar72;
              fStack_278 = fVar56;
              auStack_270 = auVar38._16_16_;
              fStack_274 = fVar73;
              local_200 = auVar66._0_16_;
              local_210 = auVar64._0_16_;
              local_220 = auVar68._0_16_;
              local_230 = auVar71._0_16_;
              local_240 = auVar77._0_16_;
              local_250 = auVar78._0_16_;
              local_260 = auVar79._0_16_;
              fStack_2dc = fVar74;
              fStack_2d8 = fVar75;
              fStack_2d4 = fVar76;
              fStack_2c8 = fVar46;
              fStack_2c4 = fVar54;
              local_1a0 = auVar39;
              (*p_Var7)(&local_2b0);
              auVar52 = ZEXT816(0) << 0x40;
              auVar79 = ZEXT1664(local_260);
              auVar78 = ZEXT1664(local_250);
              auVar77 = ZEXT1664(local_240);
              auVar71 = ZEXT1664(local_230);
              auVar68 = ZEXT1664(local_220);
              auVar64 = ZEXT1664(local_210);
              auVar66 = ZEXT1664(local_200);
              auVar63 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              fVar46 = fStack_2c8;
              fVar54 = fStack_2c4;
              fVar72 = (float)local_280._0_4_;
              fVar55 = (float)local_280._4_4_;
              fVar56 = fStack_278;
              fVar73 = fStack_274;
              fVar74 = fStack_2dc;
              fVar75 = fStack_2d8;
              fVar76 = fStack_2d4;
              auVar39 = local_1a0;
            }
            auVar20._8_8_ = uStack_2f8;
            auVar20._0_8_ = local_300;
            auVar47 = vpcmpeqd_avx(auVar52,auVar20);
            auVar24._8_8_ = uStack_2e8;
            auVar24._0_8_ = local_2f0;
            auVar42 = vpcmpeqd_avx(auVar52,auVar24);
            auVar44._16_16_ = auVar42;
            auVar44._0_16_ = auVar47;
            auVar38._0_4_ = auVar47._0_4_ ^ auVar39._0_4_;
            auVar38._4_4_ = auVar47._4_4_ ^ auVar39._4_4_;
            auVar38._8_4_ = auVar47._8_4_ ^ auVar39._8_4_;
            auVar38._12_4_ = auVar47._12_4_ ^ auVar39._12_4_;
            auVar38._16_4_ = auVar42._0_4_ ^ auVar39._16_4_;
            auVar38._20_4_ = auVar42._4_4_ ^ auVar39._20_4_;
            auVar38._24_4_ = auVar42._8_4_ ^ auVar39._24_4_;
            auVar38._28_4_ = auVar42._12_4_ ^ auVar39._28_4_;
            auVar37 = vblendvps_avx(auVar63._0_32_,*(undefined1 (*) [32])(local_2b0.ray + 0x100),
                                    auVar44);
            *(undefined1 (*) [32])(local_2b0.ray + 0x100) = auVar37;
          }
          bVar17 = (auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar18 = (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar16 = (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar15 = SUB321(auVar38 >> 0x7f,0) == '\0';
          bVar14 = (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar13 = SUB321(auVar38 >> 0xbf,0) == '\0';
          bVar12 = (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar33 = -1 < auVar38[0x1f];
          bVar32 = ((((((bVar17 && bVar18) && bVar16) && bVar15) && bVar14) && bVar13) && bVar12) &&
                   bVar33;
          if (((((((bVar17 && bVar18) && bVar16) && bVar15) && bVar14) && bVar13) && bVar12) &&
              bVar33) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
            uVar31 = uVar31 ^ 1L << (uVar8 & 0x3f);
          }
        }
      } while ((bVar32) && (uVar31 != 0));
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar35._4_4_ = uVar1;
      auVar35._0_4_ = uVar1;
      auVar35._8_4_ = uVar1;
      auVar35._12_4_ = uVar1;
      auVar47 = vcmpps_avx(auVar71._0_16_,auVar35,2);
      auVar47 = vandps_avx(auVar78._0_16_,auVar47);
      auVar47 = vandps_avx(auVar79._0_16_,auVar47);
      uVar28 = vmovmskps_avx(auVar47);
      if (uVar28 == 0) {
        return (bool)(bVar32 ^ 1U);
      }
      fVar9 = auVar77._0_4_;
      auVar36._0_4_ = (float)local_2d0 * fVar9;
      fVar10 = auVar77._4_4_;
      auVar36._4_4_ = local_2d0._4_4_ * fVar10;
      fVar11 = auVar77._8_4_;
      auVar36._8_4_ = fVar46 * fVar11;
      fVar46 = auVar77._12_4_;
      auVar36._12_4_ = fVar54 * fVar46;
      auVar43._0_4_ = fVar72 * fVar9;
      auVar43._4_4_ = fVar55 * fVar10;
      auVar43._8_4_ = fVar56 * fVar11;
      auVar43._12_4_ = fVar73 * fVar46;
      auVar53._0_4_ = local_2e0 * fVar9;
      auVar53._4_4_ = fVar74 * fVar10;
      auVar53._8_4_ = fVar75 * fVar11;
      auVar53._12_4_ = fVar76 * fVar46;
      local_1e0 = vsubps_avx(auVar36,auVar66._0_16_);
      local_1d0 = vsubps_avx(auVar43,auVar64._0_16_);
      local_1c0 = vsubps_avx(auVar53,auVar68._0_16_);
      local_1f0 = auVar71._0_16_;
      local_2d0 = context->scene;
      uVar30 = (ulong)(uVar28 & 0xff);
      uVar28 = 1 << ((byte)k & 0x1f);
      uVar31 = (ulong)((uVar28 & 0xf) << 4);
      lVar29 = (long)((int)uVar28 >> 4) * 0x10;
      auVar47 = ZEXT816(0) << 0x40;
      auVar64 = ZEXT1664(auVar47);
      auVar37 = vcmpps_avx(ZEXT1632(auVar47),ZEXT1632(auVar47),0xf);
      auVar66 = ZEXT3264(auVar37);
      auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        local_2b0.hit = (RTCHitN *)local_180;
        local_2b0.valid = (int *)&local_300;
        uVar8 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar28 = *(uint *)(local_1b0 + uVar8 * 4);
        pGVar5 = (local_2d0->geometries).items[uVar28].ptr;
        if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar30 = uVar30 ^ 1L << (uVar8 & 0x3f);
          bVar33 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar33 = false;
        }
        else {
          local_2e0 = *(float *)(ray + k * 4 + 0x100);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1f0 + uVar8 * 4);
          local_2b0.context = context->user;
          local_e0 = (sphere->primIDs).field_0.i[uVar8];
          uVar1 = *(undefined4 *)(local_1e0 + uVar8 * 4);
          local_180._4_4_ = uVar1;
          local_180._0_4_ = uVar1;
          local_180._8_4_ = uVar1;
          local_180._12_4_ = uVar1;
          local_180._16_4_ = uVar1;
          local_180._20_4_ = uVar1;
          local_180._24_4_ = uVar1;
          local_180._28_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_1d0 + uVar8 * 4);
          local_160._4_4_ = uVar1;
          local_160._0_4_ = uVar1;
          local_160._8_4_ = uVar1;
          local_160._12_4_ = uVar1;
          local_160._16_4_ = uVar1;
          local_160._20_4_ = uVar1;
          local_160._24_4_ = uVar1;
          local_160._28_4_ = uVar1;
          local_b0 = vpshufd_avx(ZEXT416(uVar28),0);
          uVar1 = *(undefined4 *)(local_1c0 + uVar8 * 4);
          local_140._4_4_ = uVar1;
          local_140._0_4_ = uVar1;
          local_140._8_4_ = uVar1;
          local_140._12_4_ = uVar1;
          local_140._16_4_ = uVar1;
          local_140._20_4_ = uVar1;
          local_140._24_4_ = uVar1;
          local_140._28_4_ = uVar1;
          local_100 = auVar64._0_32_;
          local_120 = auVar64._0_32_;
          uStack_dc = local_e0;
          uStack_d8 = local_e0;
          uStack_d4 = local_e0;
          uStack_d0 = local_e0;
          uStack_cc = local_e0;
          uStack_c8 = local_e0;
          uStack_c4 = local_e0;
          local_c0 = local_b0;
          _local_280 = auVar66._0_32_;
          uStack_9c = (local_2b0.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_2b0.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_300 = *(undefined8 *)(mm_lookupmask_ps + uVar31);
          uStack_2f8 = *(undefined8 *)(mm_lookupmask_ps + uVar31 + 8);
          local_2f0 = *(undefined8 *)(mm_lookupmask_ps + lVar29);
          uStack_2e8 = *(undefined8 *)(mm_lookupmask_ps + lVar29 + 8);
          local_2b0.geometryUserPtr = pGVar5->userPtr;
          local_2b0.N = 8;
          local_2b0.ray = (RTCRayN *)ray;
          if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_2b8 = ray;
            (*pGVar5->occlusionFilterN)(&local_2b0);
            auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar66 = ZEXT3264(_local_280);
            auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar63 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            ray = local_2b8;
          }
          auVar21._8_8_ = uStack_2f8;
          auVar21._0_8_ = local_300;
          auVar47 = vpcmpeqd_avx(auVar68._0_16_,auVar21);
          auVar25._8_8_ = uStack_2e8;
          auVar25._0_8_ = local_2f0;
          auVar42 = vpcmpeqd_avx(auVar68._0_16_,auVar25);
          auVar39._16_16_ = auVar42;
          auVar39._0_16_ = auVar47;
          _local_280 = auVar66._0_32_;
          auVar37 = _local_280 & ~auVar39;
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar37 >> 0x7f,0) == '\0') &&
                (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar37 >> 0xbf,0) == '\0') &&
              (auVar37 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar37[0x1f]) {
            auVar40._0_4_ = auVar47._0_4_ ^ auVar66._0_4_;
            auVar40._4_4_ = auVar47._4_4_ ^ auVar66._4_4_;
            auVar40._8_4_ = auVar47._8_4_ ^ auVar66._8_4_;
            auVar40._12_4_ = auVar47._12_4_ ^ auVar66._12_4_;
            auVar40._16_4_ = auVar42._0_4_ ^ auVar66._16_4_;
            auVar40._20_4_ = auVar42._4_4_ ^ auVar66._20_4_;
            auVar40._24_4_ = auVar42._8_4_ ^ auVar66._24_4_;
            auVar40._28_4_ = auVar42._12_4_ ^ auVar66._28_4_;
          }
          else {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&local_2b0);
              auVar68 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar66 = ZEXT3264(_local_280);
              auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar63 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
            }
            auVar22._8_8_ = uStack_2f8;
            auVar22._0_8_ = local_300;
            auVar47 = vpcmpeqd_avx(auVar68._0_16_,auVar22);
            auVar26._8_8_ = uStack_2e8;
            auVar26._0_8_ = local_2f0;
            auVar42 = vpcmpeqd_avx(auVar68._0_16_,auVar26);
            auVar45._16_16_ = auVar42;
            auVar45._0_16_ = auVar47;
            auVar40._0_4_ = auVar47._0_4_ ^ auVar66._0_4_;
            auVar40._4_4_ = auVar47._4_4_ ^ auVar66._4_4_;
            auVar40._8_4_ = auVar47._8_4_ ^ auVar66._8_4_;
            auVar40._12_4_ = auVar47._12_4_ ^ auVar66._12_4_;
            auVar40._16_4_ = auVar42._0_4_ ^ auVar66._16_4_;
            auVar40._20_4_ = auVar42._4_4_ ^ auVar66._20_4_;
            auVar40._24_4_ = auVar42._8_4_ ^ auVar66._24_4_;
            auVar40._28_4_ = auVar42._12_4_ ^ auVar66._28_4_;
            auVar37 = vblendvps_avx(auVar63._0_32_,*(undefined1 (*) [32])(local_2b0.ray + 0x100),
                                    auVar45);
            *(undefined1 (*) [32])(local_2b0.ray + 0x100) = auVar37;
          }
          bVar18 = (auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar19 = (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar17 = (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar16 = SUB321(auVar40 >> 0x7f,0) == '\0';
          bVar15 = (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar14 = SUB321(auVar40 >> 0xbf,0) == '\0';
          bVar13 = (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar12 = -1 < auVar40[0x1f];
          bVar33 = ((((((bVar18 && bVar19) && bVar17) && bVar16) && bVar15) && bVar14) && bVar13) &&
                   bVar12;
          if (((((((bVar18 && bVar19) && bVar17) && bVar16) && bVar15) && bVar14) && bVar13) &&
              bVar12) {
            *(float *)(ray + k * 4 + 0x100) = local_2e0;
            uVar30 = uVar30 ^ 1L << (uVar8 & 0x3f);
          }
        }
      } while ((bVar33) && (uVar30 != 0));
      return (bool)(bVar32 ^ 1U | bVar33 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& sphere)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        return SphereIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, sphere.geomID(), sphere.primID()));
      }